

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

ns_connection * ns_add_sock(ns_mgr *s,sock_t sock,ns_callback_t callback,void *user_data)

{
  ns_connection *c;
  time_t tVar1;
  ns_connection *conn;
  void *user_data_local;
  ns_callback_t callback_local;
  sock_t sock_local;
  ns_mgr *s_local;
  
  c = (ns_connection *)malloc(0xa0);
  if (c != (ns_connection *)0x0) {
    memset(c,0,0xa0);
    ns_set_non_blocking_mode(sock);
    ns_set_close_on_exec(sock);
    c->sock = sock;
    c->user_data = user_data;
    c->callback = callback;
    c->mgr = s;
    tVar1 = time((time_t *)0x0);
    c->last_io_time = tVar1;
    ns_add_conn(s,c);
  }
  return c;
}

Assistant:

struct ns_connection *ns_add_sock(struct ns_mgr *s, sock_t sock,
                                  ns_callback_t callback, void *user_data) {
  struct ns_connection *conn;
  if ((conn = (struct ns_connection *) NS_MALLOC(sizeof(*conn))) != NULL) {
    memset(conn, 0, sizeof(*conn));
    ns_set_non_blocking_mode(sock);
    ns_set_close_on_exec(sock);
    conn->sock = sock;
    conn->user_data = user_data;
    conn->callback = callback;
    conn->mgr = s;
    conn->last_io_time = time(NULL);
    ns_add_conn(s, conn);
    DBG(("%p %d", conn, sock));
  }
  return conn;
}